

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O0

void __thiscall SigNetParams::SigNetParams(SigNetParams *this,SigNetOptions *options)

{
  initializer_list<AssumeutxoData> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  Span<const_unsigned_char> s;
  string_view source_file;
  string_view logging_function;
  bool bVar1;
  uchar *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bin;
  uint256 hash;
  HashWriter h;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  CBlock *in_stack_fffffffffffffb50;
  CBlock *in_stack_fffffffffffffb58;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffb60;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffb68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  uchar *in_stack_fffffffffffffb70;
  undefined1 *__n;
  undefined4 in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb7c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  uchar *in_stack_fffffffffffffb88;
  undefined6 in_stack_fffffffffffffb98;
  undefined1 in_stack_fffffffffffffb9e;
  undefined1 in_stack_fffffffffffffb9f;
  undefined8 in_stack_fffffffffffffba0;
  CChainParams *in_stack_fffffffffffffba8;
  LogFlags in_stack_fffffffffffffbb0;
  undefined8 in_stack_fffffffffffffbb8;
  int source_line;
  size_t in_stack_fffffffffffffbd8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbe0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbe8;
  ConstevalFormatString<1U> in_stack_fffffffffffffbf8;
  size_t in_stack_fffffffffffffc00;
  char *in_stack_fffffffffffffc08;
  size_t in_stack_fffffffffffffc10;
  char *pcVar2;
  undefined1 local_3ba [33];
  undefined1 local_399;
  undefined1 local_398 [31];
  undefined1 local_379;
  undefined8 local_360;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  Level in_stack_fffffffffffffcf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  CBlock local_a8;
  undefined1 local_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined1 uStack_32;
  undefined1 uStack_31;
  undefined1 local_30;
  undefined1 uStack_2f;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  undefined1 local_28;
  undefined1 uStack_27;
  undefined1 uStack_26;
  undefined1 uStack_25;
  undefined1 uStack_24;
  undefined1 uStack_23;
  undefined1 uStack_22;
  undefined1 uStack_21;
  undefined1 uStack_20;
  undefined1 uStack_1f;
  undefined1 uStack_1e;
  undefined1 uStack_1d;
  undefined1 uStack_1c;
  undefined1 uStack_1b;
  undefined1 uStack_1a;
  undefined1 uStack_19;
  undefined1 local_18;
  undefined1 uStack_17;
  undefined1 uStack_16;
  undefined1 uStack_15;
  undefined1 uStack_14;
  undefined1 uStack_13;
  undefined1 uStack_12;
  undefined1 uStack_11;
  undefined1 uStack_10;
  undefined1 uStack_f;
  undefined1 uStack_e;
  undefined1 uStack_d;
  undefined1 uStack_c;
  undefined1 uStack_b;
  undefined1 uStack_a;
  undefined1 uStack_9;
  long local_8;
  
  source_line = (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CChainParams::CChainParams(in_stack_fffffffffffffba8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                     CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  if (bVar1) {
    std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator*
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe0);
    local_a8.vtx.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.vtx.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    local_a8.super_CBlockHeader.nTime = 0;
    local_a8.super_CBlockHeader.nBits = 0;
    local_a8.super_CBlockHeader.nNonce = 0;
    uint256::uint256((uint256 *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    *(pointer *)(in_RDI + 0x120) =
         local_a8.vtx.
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(in_RDI + 0x128) =
         local_a8.vtx.
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(undefined8 *)(in_RDI + 0x110) = local_a8.super_CBlockHeader._64_8_;
    *(undefined8 *)(in_RDI + 0x118) = local_a8.super_CBlockHeader._72_8_;
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    uint256::uint256((uint256 *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    *(undefined8 *)(in_RDI + 0x140) =
         local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._12_8_;
    *(undefined8 *)(in_RDI + 0x148) =
         local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._20_8_;
    in_RDI[0x130] =
         local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c];
    in_RDI[0x131] =
         local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d];
    in_RDI[0x132] =
         local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e];
    in_RDI[0x133] =
         local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f];
    in_RDI[0x134] =
         local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0];
    in_RDI[0x135] =
         local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1];
    in_RDI[0x136] =
         local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2];
    in_RDI[0x137] =
         local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3];
    *(undefined8 *)(in_RDI + 0x138) =
         local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._4_8_;
    in_RDI[0x180] = '\0';
    in_RDI[0x181] = '\0';
    in_RDI[0x182] = '\0';
    in_RDI[0x183] = '\0';
    in_RDI[0x184] = '\0';
    in_RDI[0x185] = '\0';
    in_RDI[0x186] = '\0';
    in_RDI[0x187] = '\0';
    in_RDI[0x188] = '\0';
    in_RDI[0x189] = '\0';
    in_RDI[0x18a] = '\0';
    in_RDI[0x18b] = '\0';
    in_RDI[0x18c] = '\0';
    in_RDI[0x18d] = '\0';
    in_RDI[0x18e] = '\0';
    in_RDI[399] = '\0';
    local_328 = 0;
    uStack_320 = 0;
    local_318 = 0;
    in_RDI[0x330] = '\0';
    in_RDI[0x331] = '\0';
    in_RDI[0x332] = '\0';
    in_RDI[0x333] = '\0';
    in_RDI[0x334] = '\0';
    in_RDI[0x335] = '\0';
    in_RDI[0x336] = '\0';
    in_RDI[0x337] = '\0';
    in_RDI[800] = '\0';
    in_RDI[0x321] = '\0';
    in_RDI[0x322] = '\0';
    in_RDI[0x323] = '\0';
    in_RDI[0x324] = '\0';
    in_RDI[0x325] = '\0';
    in_RDI[0x326] = '\0';
    in_RDI[0x327] = '\0';
    in_RDI[0x328] = '\0';
    in_RDI[0x329] = '\0';
    in_RDI[0x32a] = '\0';
    in_RDI[0x32b] = '\0';
    in_RDI[0x32c] = '\0';
    in_RDI[0x32d] = '\0';
    in_RDI[0x32e] = '\0';
    in_RDI[0x32f] = '\0';
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               in_stack_fffffffffffffb68._M_current,(char *)in_stack_fffffffffffffb60._M_current);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               in_stack_fffffffffffffb68._M_current,(char *)in_stack_fffffffffffffb60._M_current);
    pcVar2 = "Signet with challenge %s\n";
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffb58,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb50,
               (type)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    s.m_size = in_stack_fffffffffffffbd8;
    s.m_data = in_RDI;
    in_stack_fffffffffffffb50 = (CBlock *)pcVar2;
    HexStr_abi_cxx11_(s);
    in_stack_fffffffffffffb58 = &local_a8;
    in_stack_fffffffffffffb48 = 2;
    logging_function._M_str = (char *)in_stack_fffffffffffffb50;
    logging_function._M_len = in_stack_fffffffffffffc10;
    source_file._M_str = in_stack_fffffffffffffc08;
    source_file._M_len = in_stack_fffffffffffffc00;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,source_file,source_line,in_stack_fffffffffffffbb0,
               in_stack_fffffffffffffcf0,in_stack_fffffffffffffbf8,in_stack_fffffffffffffd00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  }
  else {
    util::hex_literals::
    operator___hex_v_u8<util::hex_literals::detail::Hex<143UL>___81,_33,_3,_173,_94,_14,_218,_209,_140,_177,_______>
              ();
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb58,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb58);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[34]>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb68._M_current,
               (char (*) [34])in_stack_fffffffffffffb60._M_current);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[28]>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb68._M_current,
               (char (*) [28])in_stack_fffffffffffffb60._M_current);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[16]>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb68._M_current,
               (char (*) [16])in_stack_fffffffffffffb60._M_current);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[69]>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb68._M_current,
               (char (*) [69])in_stack_fffffffffffffb60._M_current);
    uStack_9 = 0;
    uStack_a = 0;
    uStack_b = 0;
    uStack_c = 0;
    uStack_d = 0;
    uStack_e = 0;
    uStack_f = 0;
    uStack_10 = 0;
    uStack_11 = 0;
    uStack_12 = 0;
    uStack_13 = 0;
    uStack_14 = 0;
    uStack_15 = 0;
    uStack_16 = 0;
    uStack_17 = 0;
    local_18 = 0;
    uStack_19 = 0;
    uStack_1a = 0;
    uStack_1b = 0;
    uStack_1c = 0;
    uStack_1d = 0;
    uStack_1e = 0;
    uStack_1f = 0;
    uStack_20 = 0;
    uStack_21 = 0;
    uStack_22 = 0;
    uStack_23 = 2;
    uStack_24 = 0x5d;
    uStack_25 = 0xbd;
    uStack_26 = 0x66;
    uStack_27 = 0xe5;
    local_28 = 0x8f;
    in_RDI[0x120] = '\0';
    in_RDI[0x121] = '\0';
    in_RDI[0x122] = '\0';
    in_RDI[0x123] = '\0';
    in_RDI[0x124] = '\0';
    in_RDI[0x125] = '\0';
    in_RDI[0x126] = '\0';
    in_RDI[0x127] = '\0';
    in_RDI[0x128] = '\0';
    in_RDI[0x129] = '\0';
    in_RDI[0x12a] = '\0';
    in_RDI[299] = '\0';
    in_RDI[300] = '\0';
    in_RDI[0x12d] = '\0';
    in_RDI[0x12e] = '\0';
    in_RDI[0x12f] = '\0';
    in_RDI[0x110] = 0x8f;
    in_RDI[0x111] = 0xe5;
    in_RDI[0x112] = 'f';
    in_RDI[0x113] = 0xbd;
    in_RDI[0x114] = ']';
    in_RDI[0x115] = '\x02';
    in_RDI[0x116] = '\0';
    in_RDI[0x117] = '\0';
    in_RDI[0x118] = '\0';
    in_RDI[0x119] = '\0';
    in_RDI[0x11a] = '\0';
    in_RDI[0x11b] = '\0';
    in_RDI[0x11c] = '\0';
    in_RDI[0x11d] = '\0';
    in_RDI[0x11e] = '\0';
    in_RDI[0x11f] = '\0';
    uStack_29 = 0;
    uStack_2a = 0;
    uStack_2b = 1;
    uStack_2c = 0x4a;
    uStack_2d = 0xad;
    uStack_2e = 0x1d;
    uStack_2f = 0x58;
    local_30 = 0xdd;
    uStack_31 = 0xdc;
    uStack_32 = 0xb9;
    uStack_33 = 100;
    uStack_34 = 0xdd;
    uStack_35 = 0x74;
    uStack_36 = 0x9b;
    uStack_37 = 7;
    local_38 = 0x33;
    local_a8._111_1_ = 0x74;
    local_a8._110_1_ = 0xc6;
    local_a8._109_1_ = 0x30;
    local_a8._108_1_ = 0x6e;
    local_a8._107_1_ = 0x71;
    local_a8.m_checked_merkle_root = true;
    local_a8.m_checked_witness_commitment = true;
    local_a8.fChecked = true;
    local_a8.vtx.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0x73;
    local_a8.vtx.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0xa2;
    local_a8.vtx.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0xef;
    local_a8.vtx.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0xe6;
    local_a8.vtx.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0x8d;
    local_a8.vtx.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 0x41;
    local_a8.vtx.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 0x45;
    local_a8.vtx.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0x39;
    in_RDI[0x130] = '9';
    in_RDI[0x131] = 'E';
    in_RDI[0x132] = 'A';
    in_RDI[0x133] = 0x8d;
    in_RDI[0x134] = 0xe6;
    in_RDI[0x135] = 0xef;
    in_RDI[0x136] = 0xa2;
    in_RDI[0x137] = 's';
    in_RDI[0x138] = 0xf5;
    in_RDI[0x139] = '\"';
    in_RDI[0x13a] = 'k';
    in_RDI[0x13b] = 'q';
    in_RDI[0x13c] = 'n';
    in_RDI[0x13d] = '0';
    in_RDI[0x13e] = 0xc6;
    in_RDI[0x13f] = 't';
    in_RDI[0x140] = '3';
    in_RDI[0x141] = '\a';
    in_RDI[0x142] = 0x9b;
    in_RDI[0x143] = 't';
    in_RDI[0x144] = 0xdd;
    in_RDI[0x145] = 'd';
    in_RDI[0x146] = 0xb9;
    in_RDI[0x147] = 0xdc;
    in_RDI[0x148] = 0xdd;
    in_RDI[0x149] = 'X';
    in_RDI[0x14a] = '\x1d';
    in_RDI[0x14b] = 0xad;
    in_RDI[0x14c] = 'J';
    in_RDI[0x14d] = '\x01';
    in_RDI[0x14e] = '\0';
    in_RDI[0x14f] = '\0';
    in_RDI[0x180] = '\x02';
    in_RDI[0x181] = '\0';
    in_RDI[0x182] = '\0';
    in_RDI[0x183] = '\0';
    in_RDI[0x184] = '\0';
    in_RDI[0x185] = '\0';
    in_RDI[0x186] = '\0';
    in_RDI[0x187] = '\0';
    in_RDI[0x188] = '\0';
    in_RDI[0x189] = '\0';
    in_RDI[0x18a] = '\0';
    in_RDI[0x18b] = '\0';
    in_RDI[0x18c] = '\0';
    in_RDI[0x18d] = '\0';
    in_RDI[0x18e] = '\0';
    in_RDI[399] = '\0';
    in_RDI[800] = 'A';
    in_RDI[0x321] = 0xe4;
    in_RDI[0x322] = 0xbc;
    in_RDI[0x323] = 'f';
    in_RDI[0x324] = '\0';
    in_RDI[0x325] = '\0';
    in_RDI[0x326] = '\0';
    in_RDI[0x327] = '\0';
    in_RDI[0x328] = 0xe5;
    in_RDI[0x329] = '\a';
    in_RDI[0x32a] = 'T';
    in_RDI[0x32b] = '\0';
    in_RDI[0x32c] = '\0';
    in_RDI[0x32d] = '\0';
    in_RDI[0x32e] = '\0';
    in_RDI[0x32f] = '\0';
    in_RDI[0x330] = 0xf6;
    in_RDI[0x331] = 0xd7;
    in_RDI[0x332] = ']';
    in_RDI[0x333] = 0x82;
    in_RDI[0x334] = 0xcf;
    in_RDI[0x335] = '\r';
    in_RDI[0x336] = 0xb0;
    in_RDI[0x337] = '?';
  }
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  if (bVar1) {
    std::
    optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  }
  in_RDI[0x240] = '\x02';
  in_RDI[0x241] = '\0';
  in_RDI[0x242] = '\0';
  in_RDI[0x243] = '\0';
  in_RDI[0x150] = '\x01';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb50);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),in_stack_fffffffffffffb68
             ,in_stack_fffffffffffffb60);
  builtin_memcpy(in_RDI + 0x20,"P4\x03",4);
  in_RDI[0x58] = '\x01';
  in_RDI[0x59] = '\0';
  in_RDI[0x5a] = '\0';
  in_RDI[0x5b] = '\0';
  uint256::uint256((uint256 *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  in_RDI[0x6c] = '\0';
  in_RDI[0x6d] = '\0';
  in_RDI[0x6e] = '\0';
  in_RDI[0x6f] = '\0';
  in_RDI[0x70] = '\0';
  in_RDI[0x71] = '\0';
  in_RDI[0x72] = '\0';
  in_RDI[0x73] = '\0';
  in_RDI[0x74] = '\0';
  in_RDI[0x75] = '\0';
  in_RDI[0x76] = '\0';
  in_RDI[0x77] = '\0';
  in_RDI[0x78] = '\0';
  in_RDI[0x79] = '\0';
  in_RDI[0x7a] = '\0';
  in_RDI[0x7b] = '\0';
  in_RDI[0x5c] = '\0';
  in_RDI[0x5d] = '\0';
  in_RDI[0x5e] = '\0';
  in_RDI[0x5f] = '\0';
  in_RDI[0x60] = '\0';
  in_RDI[0x61] = '\0';
  in_RDI[0x62] = '\0';
  in_RDI[99] = '\0';
  in_RDI[100] = '\0';
  in_RDI[0x65] = '\0';
  in_RDI[0x66] = '\0';
  in_RDI[0x67] = '\0';
  in_RDI[0x68] = '\0';
  in_RDI[0x69] = '\0';
  in_RDI[0x6a] = '\0';
  in_RDI[0x6b] = '\0';
  in_RDI[0x7c] = '\x01';
  in_RDI[0x7d] = '\0';
  in_RDI[0x7e] = '\0';
  in_RDI[0x7f] = '\0';
  in_RDI[0x80] = '\x01';
  in_RDI[0x81] = '\0';
  in_RDI[0x82] = '\0';
  in_RDI[0x83] = '\0';
  in_RDI[0x84] = '\x01';
  in_RDI[0x85] = '\0';
  in_RDI[0x86] = '\0';
  in_RDI[0x87] = '\0';
  in_RDI[0x88] = '\x01';
  in_RDI[0x89] = '\0';
  in_RDI[0x8a] = '\0';
  in_RDI[0x8b] = '\0';
  in_RDI[0x108] = '\0';
  in_RDI[0x109] = 'u';
  in_RDI[0x10a] = '\x12';
  in_RDI[0x10b] = '\0';
  in_RDI[0x10c] = '\0';
  in_RDI[0x10d] = '\0';
  in_RDI[0x10e] = '\0';
  in_RDI[0x10f] = '\0';
  in_RDI[0x100] = 'X';
  in_RDI[0x101] = '\x02';
  in_RDI[0x102] = '\0';
  in_RDI[0x103] = '\0';
  in_RDI[0x104] = '\0';
  in_RDI[0x105] = '\0';
  in_RDI[0x106] = '\0';
  in_RDI[0x107] = '\0';
  in_RDI[0xf8] = '\0';
  in_RDI[0xf9] = '\0';
  in_RDI[0xfa] = '\0';
  in_RDI[0x90] = '\x17';
  in_RDI[0x91] = '\a';
  in_RDI[0x92] = '\0';
  in_RDI[0x93] = '\0';
  in_RDI[0x94] = 0xe0;
  in_RDI[0x95] = '\a';
  in_RDI[0x96] = '\0';
  in_RDI[0x97] = '\0';
  in_RDI[0x8c] = '\0';
  in_RDI[0x8d] = '\0';
  in_RDI[0x8e] = '\0';
  in_RDI[0x8f] = '\0';
  in_RDI[0xe8] = '\0';
  in_RDI[0xe9] = '\0';
  in_RDI[0xea] = '\0';
  in_RDI[0xeb] = '\0';
  in_RDI[0xec] = '\0';
  in_RDI[0xed] = '\0';
  in_RDI[0xee] = '\0';
  in_RDI[0xef] = '\0';
  in_RDI[0xf0] = '\0';
  in_RDI[0xf1] = '\0';
  in_RDI[0xf2] = '\0';
  in_RDI[0xf3] = 0xae;
  in_RDI[0xf4] = 'w';
  in_RDI[0xf5] = '\x03';
  in_RDI[0xf6] = '\0';
  in_RDI[0xf7] = '\0';
  in_RDI[0xd8] = '\0';
  in_RDI[0xd9] = '\0';
  in_RDI[0xda] = '\0';
  in_RDI[0xdb] = '\0';
  in_RDI[0xdc] = '\0';
  in_RDI[0xdd] = '\0';
  in_RDI[0xde] = '\0';
  in_RDI[0xdf] = '\0';
  in_RDI[0xe0] = '\0';
  in_RDI[0xe1] = '\0';
  in_RDI[0xe2] = '\0';
  in_RDI[0xe3] = '\0';
  in_RDI[0xe4] = '\0';
  in_RDI[0xe5] = '\0';
  in_RDI[0xe6] = '\0';
  in_RDI[0xe7] = '\0';
  in_RDI[0x98] = '\x1c';
  in_RDI[0x99] = '\0';
  in_RDI[0x9a] = '\0';
  in_RDI[0x9b] = '\0';
  in_RDI[0xa0] = 0xfe;
  in_RDI[0xa1] = 0xff;
  in_RDI[0xa2] = 0xff;
  in_RDI[0xa3] = 0xff;
  in_RDI[0xa4] = 0xff;
  in_RDI[0xa5] = 0xff;
  in_RDI[0xa6] = 0xff;
  in_RDI[0xa7] = 0xff;
  in_RDI[0xa8] = 0xff;
  in_RDI[0xa9] = 0xff;
  in_RDI[0xaa] = 0xff;
  in_RDI[0xab] = 0xff;
  in_RDI[0xac] = 0xff;
  in_RDI[0xad] = 0xff;
  in_RDI[0xae] = 0xff;
  in_RDI[0xaf] = '\x7f';
  in_RDI[0xb0] = '\0';
  in_RDI[0xb1] = '\0';
  in_RDI[0xb2] = '\0';
  in_RDI[0xb3] = '\0';
  in_RDI[0xb8] = '\x02';
  in_RDI[0xb9] = '\0';
  in_RDI[0xba] = '\0';
  in_RDI[0xbb] = '\0';
  in_RDI[0xc0] = 0xff;
  in_RDI[0xc1] = 0xff;
  in_RDI[0xc2] = 0xff;
  in_RDI[0xc3] = 0xff;
  in_RDI[0xc4] = 0xff;
  in_RDI[0xc5] = 0xff;
  in_RDI[0xc6] = 0xff;
  in_RDI[199] = 0xff;
  in_RDI[200] = 0xff;
  in_RDI[0xc9] = 0xff;
  in_RDI[0xca] = 0xff;
  in_RDI[0xcb] = 0xff;
  in_RDI[0xcc] = 0xff;
  in_RDI[0xcd] = 0xff;
  in_RDI[0xce] = 0xff;
  in_RDI[0xcf] = '\x7f';
  in_RDI[0xd0] = '\0';
  in_RDI[0xd1] = '\0';
  in_RDI[0xd2] = '\0';
  in_RDI[0xd3] = '\0';
  HashWriter::HashWriter
            ((HashWriter *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  HashWriter::operator<<
            ((HashWriter *)in_stack_fffffffffffffb58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb50);
  HashWriter::GetHash((HashWriter *)in_stack_fffffffffffffb68._M_current);
  base_blob<256U>::begin
            ((base_blob<256U> *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  std::array<unsigned_char,_4UL>::begin
            ((array<unsigned_char,_4UL> *)
             CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  std::copy_n<unsigned_char*,int,unsigned_char*>
            (in_stack_fffffffffffffb88,in_stack_fffffffffffffb7c,in_stack_fffffffffffffb70);
  in_RDI[0x174] = 0xbd;
  in_RDI[0x175] = 0x95;
  in_RDI[0x178] = 0xe8;
  in_RDI[0x179] = '\x03';
  in_RDI[0x17a] = '\0';
  in_RDI[0x17b] = '\0';
  in_RDI[0x17c] = '\0';
  in_RDI[0x17d] = '\0';
  in_RDI[0x17e] = '\0';
  in_RDI[0x17f] = '\0';
  local_360 = 5000000000;
  CreateGenesisBlock((uint32_t)((ulong)in_stack_fffffffffffffba8 >> 0x20),
                     (uint32_t)in_stack_fffffffffffffba8,
                     (uint32_t)((ulong)in_stack_fffffffffffffba0 >> 0x20),
                     (int32_t)in_stack_fffffffffffffba0,
                     (CAmount *)
                     CONCAT17(in_stack_fffffffffffffb9f,
                              CONCAT16(in_stack_fffffffffffffb9e,in_stack_fffffffffffffb98)));
  CBlock::operator=(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
  CBlock::~CBlock((CBlock *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  CBlockHeader::GetHash((CBlockHeader *)in_stack_fffffffffffffb68._M_current);
  *(undefined8 *)(in_RDI + 0x10) = local_1f8;
  *(undefined8 *)(in_RDI + 0x18) = uStack_1f0;
  *(undefined8 *)in_RDI = local_208;
  *(undefined8 *)(in_RDI + 8) = uStack_200;
  bVar1 = ::operator==((base_blob<256U> *)in_stack_fffffffffffffb58,
                       (base_blob<256U> *)in_stack_fffffffffffffb50);
  if (!bVar1) {
    __assert_fail("consensus.hashGenesisBlock == uint256{\"00000008819873e925422c1ff0f99f7cc9bbb232af63a077a480a3633bee1ef6\"}"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x1ee,"SigNetParams::SigNetParams(const SigNetOptions &)");
  }
  bVar1 = ::operator==((base_blob<256U> *)in_stack_fffffffffffffb58,
                       (base_blob<256U> *)in_stack_fffffffffffffb50);
  if (!bVar1) {
    __assert_fail("genesis.hashMerkleRoot == uint256{\"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b\"}"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x1ef,"SigNetParams::SigNetParams(const SigNetOptions &)");
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  AssumeutxoHash::AssumeutxoHash
            ((AssumeutxoHash *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
             (uint256 *)0xdd8d91);
  __l._M_len._0_4_ = in_stack_fffffffffffffb78;
  __l._M_array = (iterator)in_stack_fffffffffffffb70;
  __l._M_len._4_4_ = in_stack_fffffffffffffb7c;
  std::vector<AssumeutxoData,_std::allocator<AssumeutxoData>_>::operator=
            ((vector<AssumeutxoData,_std::allocator<AssumeutxoData>_> *)
             in_stack_fffffffffffffb68._M_current,__l);
  local_379 = 0x6f;
  std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
             (size_type)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68._M_current,
             (allocator_type *)in_stack_fffffffffffffb60._M_current);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb58);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  local_399 = 0xc4;
  std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
             (size_type)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68._M_current,
             (allocator_type *)in_stack_fffffffffffffb60._M_current);
  __n = local_398;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb58);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  local_3ba[1] = 0xef;
  this_01 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3ba;
  std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (this_01,(size_type)__n,in_stack_fffffffffffffb68._M_current,
             (allocator_type *)in_stack_fffffffffffffb60._M_current);
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_3ba + 2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb58);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  __l_00._M_len._0_4_ = (int)this_01;
  __l_00._M_array = __n;
  __l_00._M_len._4_4_ = (int)((ulong)this_01 >> 0x20);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(this_00,__l_00);
  __l_01._M_len._0_4_ = (int)this_01;
  __l_01._M_array = __n;
  __l_01._M_len._4_4_ = (int)((ulong)this_01 >> 0x20);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(this_00,__l_01);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50);
  in_RDI[0x2d0] = '\0';
  in_RDI[0x2d1] = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

explicit SigNetParams(const SigNetOptions& options)
    {
        std::vector<uint8_t> bin;
        vSeeds.clear();

        if (!options.challenge) {
            bin = "512103ad5e0edad18cb1f0fc0d28a3d4f1f3e445640337489abb10404f2d1e086be430210359ef5021964fe22d6f8e05b2463c9540ce96883fe3b278760f048f5189f2e6c452ae"_hex_v_u8;
            vSeeds.emplace_back("seed.signet.bitcoin.sprovoost.nl.");
            vSeeds.emplace_back("seed.signet.achownodes.xyz."); // Ava Chow, only supports x1, x5, x9, x49, x809, x849, xd, x400, x404, x408, x448, xc08, xc48, x40c

            // Hardcoded nodes can be removed once there are more DNS seeds
            vSeeds.emplace_back("178.128.221.177");
            vSeeds.emplace_back("v7ajjeirttkbnt32wpy3c6w3emwnfr3fkla7hpxcfokr3ysd3kqtzmqd.onion:38333");

            consensus.nMinimumChainWork = uint256{"0000000000000000000000000000000000000000000000000000025dbd66e58f"};
            consensus.defaultAssumeValid = uint256{"0000014aad1d58dddcb964dd749b073374c6306e716b22f573a2efe68d414539"}; // 208800
            m_assumed_blockchain_size = 2;
            m_assumed_chain_state_size = 0;
            chainTxData = ChainTxData{
                // Data from RPC: getchaintxstats 4096 0000014aad1d58dddcb964dd749b073374c6306e716b22f573a2efe68d414539
                .nTime    = 1723655233,
                .tx_count = 5507045,
                .dTxRate  = 0.06271073277261494,
            };
        } else {
            bin = *options.challenge;
            consensus.nMinimumChainWork = uint256{};
            consensus.defaultAssumeValid = uint256{};
            m_assumed_blockchain_size = 0;
            m_assumed_chain_state_size = 0;
            chainTxData = ChainTxData{
                0,
                0,
                0,
            };
            LogPrintf("Signet with challenge %s\n", HexStr(bin));
        }

        if (options.seeds) {
            vSeeds = *options.seeds;
        }

        m_chain_type = ChainType::SIGNET;
        consensus.signet_blocks = true;
        consensus.signet_challenge.assign(bin.begin(), bin.end());
        consensus.nSubsidyHalvingInterval = 210000;
        consensus.BIP34Height = 1;
        consensus.BIP34Hash = uint256{};
        consensus.BIP65Height = 1;
        consensus.BIP66Height = 1;
        consensus.CSVHeight = 1;
        consensus.SegwitHeight = 1;
        consensus.nPowTargetTimespan = 14 * 24 * 60 * 60; // two weeks
        consensus.nPowTargetSpacing = 10 * 60;
        consensus.fPowAllowMinDifficultyBlocks = false;
        consensus.enforce_BIP94 = false;
        consensus.fPowNoRetargeting = false;
        consensus.nRuleChangeActivationThreshold = 1815; // 90% of 2016
        consensus.nMinerConfirmationWindow = 2016; // nPowTargetTimespan / nPowTargetSpacing
        consensus.MinBIP9WarningHeight = 0;
        consensus.powLimit = uint256{"00000377ae000000000000000000000000000000000000000000000000000000"};
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].bit = 28;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nStartTime = Consensus::BIP9Deployment::NEVER_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].min_activation_height = 0; // No activation delay

        // Activation of Taproot (BIPs 340-342)
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].bit = 2;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nStartTime = Consensus::BIP9Deployment::ALWAYS_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].min_activation_height = 0; // No activation delay

        // message start is defined as the first 4 bytes of the sha256d of the block script
        HashWriter h{};
        h << consensus.signet_challenge;
        uint256 hash = h.GetHash();
        std::copy_n(hash.begin(), 4, pchMessageStart.begin());

        nDefaultPort = 38333;
        nPruneAfterHeight = 1000;

        genesis = CreateGenesisBlock(1598918400, 52613770, 0x1e0377ae, 1, 50 * COIN);
        consensus.hashGenesisBlock = genesis.GetHash();
        assert(consensus.hashGenesisBlock == uint256{"00000008819873e925422c1ff0f99f7cc9bbb232af63a077a480a3633bee1ef6"});
        assert(genesis.hashMerkleRoot == uint256{"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b"});

        vFixedSeeds.clear();

        m_assumeutxo_data = {
            {
                .height = 160'000,
                .hash_serialized = AssumeutxoHash{uint256{"fe0a44309b74d6b5883d246cb419c6221bcccf0b308c9b59b7d70783dbdf928a"}},
                .m_chain_tx_count = 2289496,
                .blockhash = consteval_ctor(uint256{"0000003ca3c99aff040f2563c2ad8f8ec88bd0fd6b8f0895cfaf1ef90353a62c"}),
            }
        };

        base58Prefixes[PUBKEY_ADDRESS] = std::vector<unsigned char>(1,111);
        base58Prefixes[SCRIPT_ADDRESS] = std::vector<unsigned char>(1,196);
        base58Prefixes[SECRET_KEY] =     std::vector<unsigned char>(1,239);
        base58Prefixes[EXT_PUBLIC_KEY] = {0x04, 0x35, 0x87, 0xCF};
        base58Prefixes[EXT_SECRET_KEY] = {0x04, 0x35, 0x83, 0x94};

        bech32_hrp = "tb";

        fDefaultConsistencyChecks = false;
        m_is_mockable_chain = false;
    }